

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::StatTask::inputsAvailable(StatTask *this,TaskInterface ti)

{
  FileInfo outputInfo;
  bool bVar1;
  BuildSystemImpl *this_00;
  FileSystem *fileSystem;
  TaskInterface ti_00;
  StatNode *this_01;
  undefined1 local_1e0 [8];
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  BuildValue local_190;
  ValueType local_120;
  BuildValue local_108;
  ValueType local_98;
  StatTask *local_80;
  void *local_78;
  undefined1 local_70 [8];
  FileInfo info;
  StatTask *this_local;
  TaskInterface ti_local;
  
  ti_00.ctx = ti.ctx;
  local_80 = (StatTask *)ti.impl;
  this_01 = this->statnode;
  ti_00.impl = ti_00.ctx;
  local_78 = ti_00.ctx;
  info.checksum.bytes._24_8_ = this;
  this_local = local_80;
  ti_local.impl = ti_00.ctx;
  this_00 = getBuildSystem((anon_unknown_dwarf_145302 *)local_80,ti_00);
  fileSystem = BuildSystemImpl::getFileSystem(this_00);
  llbuild::buildsystem::StatNode::getFileInfo((FileInfo *)local_70,this_01,fileSystem);
  bVar1 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_70);
  if (bVar1) {
    llbuild::buildsystem::BuildValue::makeMissingInput();
    llbuild::buildsystem::BuildValue::toData(&local_98,&local_108);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_98,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_98);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_108);
  }
  else {
    memcpy(local_1e0,local_70,0x50);
    outputInfo.inode = local_1d0;
    outputInfo.device = uStack_1d8;
    outputInfo.mode = uStack_1c8;
    outputInfo.size = local_1c0;
    outputInfo.modTime.seconds = uStack_1b8;
    outputInfo.modTime.nanoseconds = local_1b0;
    outputInfo.checksum.bytes[0] = (undefined1)uStack_1a8;
    outputInfo.checksum.bytes[1] = uStack_1a8._1_1_;
    outputInfo.checksum.bytes[2] = uStack_1a8._2_1_;
    outputInfo.checksum.bytes[3] = uStack_1a8._3_1_;
    outputInfo.checksum.bytes[4] = uStack_1a8._4_1_;
    outputInfo.checksum.bytes[5] = uStack_1a8._5_1_;
    outputInfo.checksum.bytes[6] = uStack_1a8._6_1_;
    outputInfo.checksum.bytes[7] = uStack_1a8._7_1_;
    outputInfo.checksum.bytes[8] = (undefined1)local_1a0;
    outputInfo.checksum.bytes[9] = local_1a0._1_1_;
    outputInfo.checksum.bytes[10] = local_1a0._2_1_;
    outputInfo.checksum.bytes[0xb] = local_1a0._3_1_;
    outputInfo.checksum.bytes[0xc] = local_1a0._4_1_;
    outputInfo.checksum.bytes[0xd] = local_1a0._5_1_;
    outputInfo.checksum.bytes[0xe] = local_1a0._6_1_;
    outputInfo.checksum.bytes[0xf] = local_1a0._7_1_;
    outputInfo.checksum.bytes[0x10] = (undefined1)uStack_198;
    outputInfo.checksum.bytes[0x11] = uStack_198._1_1_;
    outputInfo.checksum.bytes[0x12] = uStack_198._2_1_;
    outputInfo.checksum.bytes[0x13] = uStack_198._3_1_;
    outputInfo.checksum.bytes[0x14] = uStack_198._4_1_;
    outputInfo.checksum.bytes[0x15] = uStack_198._5_1_;
    outputInfo.checksum.bytes[0x16] = uStack_198._6_1_;
    outputInfo.checksum.bytes[0x17] = uStack_198._7_1_;
    outputInfo.checksum.bytes._24_8_ = this_01;
    llbuild::buildsystem::BuildValue::makeExistingInput(outputInfo);
    llbuild::buildsystem::BuildValue::toData(&local_120,&local_190);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_120,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_120);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_190);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.

    // Get the information on the file.
    auto info = statnode.getFileInfo(getBuildSystem(ti).getFileSystem());
    if (info.isMissing()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    ti.complete(BuildValue::makeExistingInput(info).toData());
  }